

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::PatchJumpOffset<short>
          (ByteCodeWriter *this,
          List<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *jumpOffset,byte *byteBuffer,uint byteCount)

{
  anon_class_32_4_9ba205d3 map;
  undefined4 uStack_24;
  
  map._4_4_ = uStack_24;
  map.byteCount = byteCount;
  map.byteBuffer = byteBuffer;
  map.this = this;
  map.jumpOffset = jumpOffset;
  JsUtil::
  List<Js::ByteCodeWriter::JumpInfo,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
  ::
  MapFrom<Js::ByteCodeWriter::PatchJumpOffset<short>(JsUtil::List<Js::ByteCodeWriter::JumpInfo,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>*,unsigned_char*,unsigned_int)::_lambda(int,Js::ByteCodeWriter::JumpInfo&)_1_>
            ((List<Js::ByteCodeWriter::JumpInfo,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
              *)jumpOffset,0,map);
  return;
}

Assistant:

void ByteCodeWriter::PatchJumpOffset(JsUtil::List<JumpInfo, ArenaAllocator> * jumpOffset, byte * byteBuffer, uint byteCount)
    {
        jumpOffset->Map([=](int index, JumpInfo& jumpInfo)
        {
            //
            // Read "labelID" stored at the offset within the byte-code.
            //
            uint jumpByteOffset = jumpInfo.patchOffset;
            AssertMsg(jumpByteOffset < byteCount - sizeof(T),
                "Must have valid jump site within byte-code to back-patch");

            unaligned T * pnBackPatch = reinterpret_cast<unaligned T *>(&byteBuffer[jumpByteOffset]);

            ByteCodeLabel labelID = jumpInfo.labelId;
            CheckLabel(labelID);

            uint offsetToEndOfLayoutByteSize = *pnBackPatch;
            Assert(offsetToEndOfLayoutByteSize < 0x20);

            //
            // Use "labelID" to lookup the destination offset, replacing the temporary data in the
            // byte-code.
            //

            uint labelByteOffset = m_labelOffsets->Item(labelID);
            AssertMsg(labelByteOffset != UINT_MAX, "ERROR: Destination labels must be marked before closing");

            int relativeJumpOffset = labelByteOffset - jumpByteOffset - offsetToEndOfLayoutByteSize;
#ifdef BYTECODE_BRANCH_ISLAND
            Assert(!useBranchIsland || (jumpOffset != m_jumpOffsets || (relativeJumpOffset < GetBranchLimit() && relativeJumpOffset >= -GetBranchLimit())));
#endif
            Assert((T)relativeJumpOffset == relativeJumpOffset);
            *pnBackPatch = (T)relativeJumpOffset;
        });
    }